

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer_shaders.h
# Opt level: O0

char * openglrenderer_fsh_blur(void)

{
  return 
  "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; uniform highp vec4 dims; uniform highp vec2 step; uniform highp float sigma; uniform int radius; varying highp vec2 vT; highp float gauss(float x) { return exp(-(x*x)/sigma); } void main() { highp float r = float(radius); highp float weights = 0.5 * gauss(r); highp vec4 result = weights * texture2D(t, vT - float(radius) * step); for (int i=-radius+1; i<=radius; i+=2) { highp float p1 = float(i); highp float w1 = gauss(p1); highp float p2 = float(i+1); highp float w2 = gauss(p2); highp float w = w1 + w2; highp float p = (p1 * w1 + p2 * w2) / w; result += w * texture2D(t, vT + p * step); weights += w; } gl_FragColor = result / weights; }"
  ;
}

Assistant:

inline const char *openglrenderer_fsh_blur() { return RENGINE_GLSL(
    uniform lowp sampler2D t;
    uniform highp vec4 dims;
    uniform highp vec2 step;
    uniform highp float sigma;
    uniform int radius;
    varying highp vec2 vT;
    highp float gauss(float x) { return exp(-(x*x)/sigma); }
    void main() {
        highp float r = float(radius);
        highp float weights = 0.5 * gauss(r);
        highp vec4 result = weights * texture2D(t, vT - float(radius) * step);
        for (int i=-radius+1; i<=radius; i+=2) {
            highp float p1 = float(i);
            highp float w1 = gauss(p1);
            highp float p2 = float(i+1);
            highp float w2 = gauss(p2);
            highp float w = w1 + w2;
            highp float p = (p1 * w1 + p2 * w2) / w;
            result += w * texture2D(t, vT + p * step);
            weights += w;
        }
        gl_FragColor = result / weights;
    }
); }